

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O0

P<r_exec::Overlay> * __thiscall
core::P<r_exec::Overlay>::operator=(P<r_exec::Overlay> *this,P<r_exec::Overlay> *p)

{
  P<r_exec::Overlay> *pPVar1;
  P<r_exec::Overlay> *p_local;
  P<r_exec::Overlay> *this_local;
  
  pPVar1 = operator=(this,(Overlay *)p->object);
  return pPVar1;
}

Assistant:

P<C> &operator =(const P<C> &p)
    {
        return this->operator =((C *)p.object);
    }